

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O2

int signature_compare(signature s,type_id ret,type_id *args,size_t size)

{
  int iVar1;
  type_id tVar2;
  ulong uVar3;
  type_conflict t;
  size_t *psVar4;
  
  if (((s != (signature)0x0) && (s->count == size)) && (tVar2 = type_index(s->ret), tVar2 == ret)) {
    psVar4 = &s[1].count;
    uVar3 = 0;
    do {
      if (size == uVar3) {
        return 0;
      }
      if (uVar3 < s->count) {
        t = (type_conflict)*psVar4;
      }
      else {
        t = (type_conflict)0x0;
      }
      iVar1 = args[uVar3];
      tVar2 = type_index(t);
      uVar3 = uVar3 + 1;
      psVar4 = psVar4 + 3;
    } while (iVar1 == tVar2);
  }
  return 1;
}

Assistant:

int signature_compare(signature s, type_id ret, type_id args[], size_t size)
{
	size_t iterator;

	if (s == NULL)
	{
		return 1;
	}

	if (s->count != size)
	{
		return 1;
	}

	if (type_index(s->ret) != ret)
	{
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		type t = signature_get_type(s, iterator);

		if (args[iterator] != type_index(t))
		{
			return 1;
		}
	}

	return 0;
}